

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Product.h
# Opt level: O3

optional<covenant::DFA<covenant::Sym>_> * __thiscall
covenant::Product<covenant::Sym>::intersect_all
          (optional<covenant::DFA<covenant::Sym>_> *__return_storage_ptr__,
          Product<covenant::Sym> *this,
          vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
          *reg_langs,uint alphstart,uint alphsz)

{
  long lVar1;
  element_type *peVar2;
  shared_count sVar3;
  TerminalFactory *__tmp;
  const_iterator cVar4;
  long *plVar5;
  pointer pDVar6;
  ostream *this_00;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  dfa_t reg_lang_i;
  optional<covenant::DFA<covenant::Sym>_> inter;
  optional<covenant::DFA<covenant::Sym>_> next;
  dfa_t reg_lang_1;
  dfa_t reg_lang_0;
  dfa_t local_308;
  _Base_ptr local_290;
  dfa_t local_288;
  undefined1 local_218 [32];
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  local_1f8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1e0;
  vector<bool,_std::allocator<bool>_> local_1c8;
  undefined1 *local_1a0;
  undefined1 local_198 [48];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_168;
  vector<bool,_std::allocator<bool>_> local_150;
  type local_128;
  shared_count asStack_120 [2];
  dfa_t local_110;
  dfa_t local_a0;
  
  DFA<covenant::Sym>::makeDFA
            (&local_a0,
             (reg_langs->
             super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
             )._M_impl.super__Vector_impl_data._M_start,alphstart,alphsz);
  DFA<covenant::Sym>::makeDFA
            (&local_110,
             (reg_langs->
             super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,alphstart,alphsz);
  if (avy::AvyLogFlag == '\x01') {
    local_218._0_8_ = local_218 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"verbose","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)avy::AvyLog_abi_cxx11_,(key_type *)local_218);
    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
      operator_delete((void *)local_218._0_8_);
    }
    if (cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Automata 0 has ",0xf);
      plVar5 = (long *)std::ostream::operator<<
                                 (&std::cout,
                                  (int)((ulong)((long)local_a0.trans.
                                                                                                            
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)local_a0.trans.
                                                                                                          
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                  -0x55555555);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
    }
  }
  if (avy::AvyLogFlag == '\x01') {
    local_218._0_8_ = local_218 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"verbose","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)avy::AvyLog_abi_cxx11_,(key_type *)local_218);
    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
      operator_delete((void *)local_218._0_8_);
    }
    if (cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Automata 1 has ",0xf);
      plVar5 = (long *)std::ostream::operator<<
                                 (&std::cout,
                                  (int)((ulong)((long)local_110.trans.
                                                                                                            
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)local_110.trans.
                                                                                                          
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                  -0x55555555);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
    }
  }
  DFA<covenant::Sym>::intersection
            ((optional<covenant::DFA<covenant::Sym>_> *)local_218,&local_a0,&local_110);
  if (local_218[0] == (string)0x1) {
    local_308._tfac.px = (element_type *)local_218._8_8_;
    local_308._tfac.pn.pi_ = (sp_counted_base *)local_218._16_8_;
    if (local_218._16_8_ != 0) {
      LOCK();
      *(int *)(local_218._16_8_ + 8) = *(int *)(local_218._16_8_ + 8) + 1;
      UNLOCK();
    }
    local_308.start = local_218._24_4_;
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::vector(&local_308.trans,&local_1f8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_308.eps,&local_1e0);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_308.accepts,&local_1c8);
    pDVar6 = (reg_langs->
             super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (2 < (ulong)(((long)(reg_langs->
                           super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar6 >> 4) *
                   0x6db6db6db6db6db7)) {
      local_290 = (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
      uVar7 = 2;
      uVar8 = 3;
      do {
        DFA<covenant::Sym>::makeDFA(&local_288,pDVar6 + uVar7,alphstart,alphsz);
        if (avy::AvyLogFlag == '\x01') {
          local_1a0 = local_198 + 8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"verbose","");
          cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)avy::AvyLog_abi_cxx11_,(key_type *)&local_1a0);
          if (local_1a0 != local_198 + 8) {
            operator_delete(local_1a0);
          }
          if (cVar4._M_node != local_290) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Automata ",9);
            this_00 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(this_00," has ",5);
            plVar5 = (long *)std::ostream::operator<<
                                       (this_00,(int)((ulong)((long)local_288.trans.
                                                                                                                                        
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_288.trans.
                                                                                                                
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                                -0x55555555);
            std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
            std::ostream::put((char)plVar5);
            std::ostream::flush();
          }
        }
        DFA<covenant::Sym>::intersection
                  ((optional<covenant::DFA<covenant::Sym>_> *)&local_1a0,&local_308,&local_288);
        sVar3.pi_ = local_308._tfac.pn.pi_;
        peVar2 = local_308._tfac.px;
        if (local_1a0._0_1_ == false) {
          boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::~optional_base
                    ((optional_base<covenant::DFA<covenant::Sym>_> *)&local_1a0);
          if (local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(&local_288.eps);
          std::
          vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
          ::~vector(&local_288.trans);
          boost::detail::shared_count::~shared_count(&local_288._tfac.pn);
          if (local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(&local_308.eps);
          std::
          vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
          ::~vector(&local_308.trans);
          boost::detail::shared_count::~shared_count(&local_308._tfac.pn);
          goto LAB_0013ef0f;
        }
        if (local_198._8_8_ != 0) {
          LOCK();
          *(int *)(local_198._8_8_ + 8) = *(int *)(local_198._8_8_ + 8) + 1;
          UNLOCK();
        }
        local_308._tfac.px = (element_type *)local_198._0_8_;
        local_308._tfac.pn.pi_ = (sp_counted_base *)local_198._8_8_;
        local_128 = (type)peVar2;
        asStack_120[0].pi_ = sVar3.pi_;
        boost::detail::shared_count::~shared_count(asStack_120);
        local_308.start = local_198._16_4_;
        std::
        vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
        ::operator=(&local_308.trans,
                    (vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                     *)(local_198 + 0x18));
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator=(&local_308.eps,&local_168);
        std::vector<bool,_std::allocator<bool>_>::operator=(&local_308.accepts,&local_150);
        boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::~optional_base
                  ((optional_base<covenant::DFA<covenant::Sym>_> *)&local_1a0);
        if (local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
          local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
          local_288.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&local_288.eps);
        std::
        vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
        ::~vector(&local_288.trans);
        boost::detail::shared_count::~shared_count(&local_288._tfac.pn);
        pDVar6 = (reg_langs->
                 super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar7 = ((long)(reg_langs->
                       super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar6 >> 4) *
                0x6db6db6db6db6db7;
        bVar9 = uVar8 <= uVar7;
        lVar1 = uVar7 - uVar8;
        uVar7 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar9 && lVar1 != 0);
    }
    (__return_storage_ptr__->super_type).m_initialized = false;
    boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::construct
              (&__return_storage_ptr__->super_type,&local_308);
    if (local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_308.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_308.eps);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_308.trans);
    boost::detail::shared_count::~shared_count(&local_308._tfac.pn);
  }
  else {
LAB_0013ef0f:
    (__return_storage_ptr__->super_type).m_initialized = false;
  }
  boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::~optional_base
            ((optional_base<covenant::DFA<covenant::Sym>_> *)local_218);
  if (local_110.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_110.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_110.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_110.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_110.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_110.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_110.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_110.eps);
  std::
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ::~vector(&local_110.trans);
  boost::detail::shared_count::~shared_count(&local_110._tfac.pn);
  if (local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_a0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_a0.eps);
  std::
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ::~vector(&local_a0.trans);
  boost::detail::shared_count::~shared_count(&local_a0._tfac.pn);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<dfa_t> intersect_all(const vector<dfa_t>& reg_langs, 
                                       unsigned int alphstart, 
                                       unsigned int alphsz)
  {
    dfa_t reg_lang_0 = reg_langs[0].makeDFA (alphstart, alphsz);
    dfa_t reg_lang_1 = reg_langs[1].makeDFA (alphstart, alphsz);

    LOG("verbose", std::cout << "Automata 0 has " << reg_lang_0.nStates() << endl);
    LOG("verbose", std::cout << "Automata 1 has " << reg_lang_1.nStates() << endl);

    boost::optional<dfa_t> inter  = dfa_t::intersection(reg_lang_0, reg_lang_1);
    bool result = (inter ? true : false);
    if (result)
    {
      dfa_t prev = *inter;

      for(unsigned int i=2; i < reg_langs.size(); i++)
      {
        dfa_t reg_lang_i = reg_langs[i].makeDFA (alphstart, alphsz);

        LOG ("verbose", 
             cout << "Automata " << i << " has " << reg_lang_i.nStates() << endl);

        boost::optional<dfa_t> next = dfa_t::intersection(prev, reg_lang_i);

        result &= (next ? true : false);

        if (!result)
          break;
        
        prev = *next;
      }

      if (result)
        return boost::optional<dfa_t> (prev);
    }
    return boost::optional<dfa_t> ();
  }